

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalCommonGenerator.cxx
# Opt level: O2

string * __thiscall
cmGlobalCommonGenerator::GetEditCacheCommand_abi_cxx11_
          (string *__return_storage_ptr__,cmGlobalCommonGenerator *this)

{
  cmake *this_00;
  size_type sVar1;
  int iVar2;
  string *psVar3;
  cmValue cVar4;
  allocator<char> local_82;
  allocator<char> local_81;
  string local_80;
  string editCacheCommand;
  allocator<char> local_40 [32];
  
  cmGlobalGenerator::GetExtraGeneratorName_abi_cxx11_
            (&editCacheCommand,&this->super_cmGlobalGenerator);
  sVar1 = editCacheCommand._M_string_length;
  std::__cxx11::string::~string((string *)&editCacheCommand);
  if (sVar1 != 0) {
    psVar3 = cmSystemTools::GetCMakeGUICommand_abi_cxx11_();
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar3);
    return __return_storage_ptr__;
  }
  this_00 = (this->super_cmGlobalGenerator).CMakeInstance;
  std::__cxx11::string::string((string *)&editCacheCommand,(string *)&this_00->CMakeEditCommand);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_80,"CMAKE_EDIT_COMMAND",local_40);
  cVar4 = cmake::GetCacheDefinition(this_00,&local_80);
  sVar1 = editCacheCommand._M_string_length;
  if (cVar4.Value == (string *)0x0) {
    std::__cxx11::string::~string((string *)&local_80);
  }
  else {
    std::__cxx11::string::~string((string *)&local_80);
    if (sVar1 == 0) goto LAB_004b476c;
  }
  iVar2 = (*(this->super_cmGlobalGenerator)._vptr_cmGlobalGenerator[0x44])(this);
  if (((byte)iVar2 & editCacheCommand._M_string_length == 0) == 1) {
    cmSystemTools::GetCMakeCursesCommand_abi_cxx11_();
    std::__cxx11::string::_M_assign((string *)&editCacheCommand);
  }
  if (editCacheCommand._M_string_length == 0) {
    cmSystemTools::GetCMakeGUICommand_abi_cxx11_();
    std::__cxx11::string::_M_assign((string *)&editCacheCommand);
    if (editCacheCommand._M_string_length == 0) goto LAB_004b476c;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_80,"CMAKE_EDIT_COMMAND",&local_81);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_40,"Path to cache edit program executable.",&local_82);
  cmake::AddCacheEntry(this_00,&local_80,&editCacheCommand,(string *)local_40,4);
  std::__cxx11::string::~string((string *)local_40);
  std::__cxx11::string::~string((string *)&local_80);
LAB_004b476c:
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_80,"CMAKE_EDIT_COMMAND",local_40);
  cVar4 = cmake::GetCacheDefinition(this_00,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  if (cVar4.Value == (string *)0x0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)cVar4.Value);
  }
  std::__cxx11::string::~string((string *)&editCacheCommand);
  return __return_storage_ptr__;
}

Assistant:

std::string cmGlobalCommonGenerator::GetEditCacheCommand() const
{
  // If generating for an extra IDE, the edit_cache target cannot
  // launch a terminal-interactive tool, so always use cmake-gui.
  if (!this->GetExtraGeneratorName().empty()) {
    return cmSystemTools::GetCMakeGUICommand();
  }

  // Use an internal cache entry to track the latest dialog used
  // to edit the cache, and use that for the edit_cache target.
  cmake* cm = this->GetCMakeInstance();
  std::string editCacheCommand = cm->GetCMakeEditCommand();
  if (!cm->GetCacheDefinition("CMAKE_EDIT_COMMAND") ||
      !editCacheCommand.empty()) {
    if (this->SupportsDirectConsole() && editCacheCommand.empty()) {
      editCacheCommand = cmSystemTools::GetCMakeCursesCommand();
    }
    if (editCacheCommand.empty()) {
      editCacheCommand = cmSystemTools::GetCMakeGUICommand();
    }
    if (!editCacheCommand.empty()) {
      cm->AddCacheEntry("CMAKE_EDIT_COMMAND", editCacheCommand,
                        "Path to cache edit program executable.",
                        cmStateEnums::INTERNAL);
    }
  }
  cmValue edit_cmd = cm->GetCacheDefinition("CMAKE_EDIT_COMMAND");
  return edit_cmd ? *edit_cmd : std::string();
}